

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::RepeatedStringView::GeneratePrivateMembers
          (RepeatedStringView *this,Printer *p)

{
  if ((this->super_FieldGeneratorBase).should_split_ == true) {
    io::Printer::Emit(p,0x4b,
                      "\n        $pbi$::RawPtr<$pb$::RepeatedPtrField<std::string>> $name$_;\n      "
                     );
    return;
  }
  io::Printer::Emit(p,0x3c,"\n        $pb$::RepeatedPtrField<std::string> $name$_;\n      ");
  return;
}

Assistant:

void GeneratePrivateMembers(io::Printer* p) const override {
    if (should_split()) {
      p->Emit(R"cc(
        $pbi$::RawPtr<$pb$::RepeatedPtrField<std::string>> $name$_;
      )cc");
    } else {
      p->Emit(R"cc(
        $pb$::RepeatedPtrField<std::string> $name$_;
      )cc");
    }
  }